

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrl_params_translate.c
# Opt level: O0

int get_dh_dsa_payload_g(state state,translation_st *translation,translation_ctx_st *ctx)

{
  int iVar1;
  dh_st *dh;
  dsa_st *d;
  translation_st *in_RDX;
  state in_ESI;
  BIGNUM *bn;
  undefined4 in_stack_ffffffffffffffd8;
  translation_ctx_st *ctx_00;
  
  ctx_00 = (translation_ctx_st *)0x0;
  iVar1 = EVP_PKEY_get_base_id((EVP_PKEY *)0x41b079);
  if (iVar1 == 0x1c) {
    dh = EVP_PKEY_get0_DH((EVP_PKEY *)0x41b09f);
    ctx_00 = (translation_ctx_st *)DH_get0_g(dh);
  }
  else if (iVar1 == 0x74) {
    d = EVP_PKEY_get0_DSA((EVP_PKEY *)0x41b0bc);
    ctx_00 = (translation_ctx_st *)DSA_get0_g(d);
  }
  iVar1 = get_payload_bn(in_ESI,in_RDX,ctx_00,(BIGNUM *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  return iVar1;
}

Assistant:

static int get_dh_dsa_payload_g(enum state state,
                                const struct translation_st *translation,
                                struct translation_ctx_st *ctx)
{
    const BIGNUM *bn = NULL;

    switch (EVP_PKEY_get_base_id(ctx->p2)) {
#ifndef OPENSSL_NO_DH
    case EVP_PKEY_DH:
        bn = DH_get0_g(EVP_PKEY_get0_DH(ctx->p2));
        break;
#endif
#ifndef OPENSSL_NO_DSA
    case EVP_PKEY_DSA:
        bn = DSA_get0_g(EVP_PKEY_get0_DSA(ctx->p2));
        break;
#endif
    }

    return get_payload_bn(state, translation, ctx, bn);
}